

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall CommandDrawBar::Parse(CommandDrawBar *this,FScanner *sc,bool fullScreenOffsets)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  PClassActor *pPVar4;
  int local_30;
  int local_2c;
  bool parenthesized_1;
  bool parenthesized;
  bool fullScreenOffsets_local;
  FScanner *sc_local;
  CommandDrawBar *this_local;
  
  FScanner::MustGetToken(sc,0x102);
  iVar3 = SBarInfo::newImage((this->super_SBarInfoCommand).script,sc->String);
  this->foreground = iVar3;
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x102);
  iVar3 = SBarInfo::newImage((this->super_SBarInfoCommand).script,sc->String);
  this->background = iVar3;
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x101);
  bVar1 = FScanner::Compare(sc,"health");
  if (bVar1) {
    this->type = HEALTH;
    ParseComparator(this,sc);
  }
  else {
    bVar1 = FScanner::Compare(sc,"armor");
    if (bVar1) {
      this->type = ARMOR;
      ParseComparator(this,sc);
    }
    else {
      bVar1 = FScanner::Compare(sc,"ammo1");
      if (bVar1) {
        this->type = AMMO1;
      }
      else {
        bVar1 = FScanner::Compare(sc,"ammo2");
        if (bVar1) {
          this->type = AMMO2;
        }
        else {
          bVar1 = FScanner::Compare(sc,"ammo");
          if (bVar1) {
            bVar1 = FScanner::CheckToken(sc,0x28);
            if ((!bVar1) || (bVar2 = FScanner::CheckToken(sc,0x102), !bVar2)) {
              FScanner::MustGetToken(sc,0x101);
            }
            this->type = AMMO;
            pPVar4 = PClass::FindActor(sc->String);
            (this->data).field_1.inventoryItem = pPVar4;
            if (((this->data).field_1.inventoryItem == (PClassActor *)0x0) ||
               (bVar2 = PClass::IsAncestorOf
                                  (AAmmo::RegistrationInfo.MyClass,
                                   &((this->data).field_1.inventoryItem)->super_PClass), !bVar2)) {
              FScanner::ScriptMessage(sc,"\'%s\' is not a type of ammo.",sc->String);
              (this->data).field_1.inventoryItem = (PClassActor *)AAmmo::RegistrationInfo.MyClass;
            }
            if (bVar1) {
              FScanner::MustGetToken(sc,0x29);
            }
          }
          else {
            bVar1 = FScanner::Compare(sc,"frags");
            if (bVar1) {
              this->type = FRAGS;
            }
            else {
              bVar1 = FScanner::Compare(sc,"kills");
              if (bVar1) {
                this->type = KILLS;
              }
              else {
                bVar1 = FScanner::Compare(sc,"items");
                if (bVar1) {
                  this->type = ITEMS;
                }
                else {
                  bVar1 = FScanner::Compare(sc,"secrets");
                  if (bVar1) {
                    this->type = SECRETS;
                  }
                  else {
                    bVar1 = FScanner::Compare(sc,"airtime");
                    if (bVar1) {
                      this->type = AIRTIME;
                    }
                    else {
                      bVar1 = FScanner::Compare(sc,"savepercent");
                      if (bVar1) {
                        this->type = SAVEPERCENT;
                      }
                      else {
                        bVar1 = FScanner::Compare(sc,"poweruptime");
                        if (bVar1) {
                          bVar1 = FScanner::CheckToken(sc,0x28);
                          this->type = POWERUPTIME;
                          if ((!bVar1) || (bVar2 = FScanner::CheckToken(sc,0x102), !bVar2)) {
                            FScanner::MustGetToken(sc,0x101);
                          }
                          pPVar4 = PClass::FindActor(sc->String);
                          (this->data).field_1.inventoryItem = pPVar4;
                          if (((this->data).field_1.inventoryItem == (PClassActor *)0x0) ||
                             (bVar2 = PClass::IsAncestorOf
                                                (APowerupGiver::RegistrationInfo.MyClass,
                                                 &((this->data).field_1.inventoryItem)->super_PClass
                                                ), !bVar2)) {
                            FScanner::ScriptMessage
                                      (sc,"\'%s\' is not a type of PowerupGiver.",sc->String);
                            (this->data).field_1.inventoryItem =
                                 (PClassActor *)APowerupGiver::RegistrationInfo.MyClass;
                          }
                          if (bVar1) {
                            FScanner::MustGetToken(sc,0x29);
                          }
                        }
                        else {
                          this->type = INVENTORY;
                          pPVar4 = PClass::FindActor(sc->String);
                          (this->data).field_1.inventoryItem = pPVar4;
                          if (((this->data).field_1.inventoryItem == (PClassActor *)0x0) ||
                             (bVar1 = PClass::IsAncestorOf
                                                (AInventory::RegistrationInfo.MyClass,
                                                 &((this->data).field_1.inventoryItem)->super_PClass
                                                ), !bVar1)) {
                            FScanner::ScriptMessage
                                      (sc,"\'%s\' is not a type of inventory item.",sc->String);
                            (this->data).field_1.inventoryItem =
                                 (PClassActor *)AInventory::RegistrationInfo.MyClass;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  FScanner::MustGetToken(sc,0x2c);
  FScanner::MustGetToken(sc,0x101);
  bVar1 = FScanner::Compare(sc,"horizontal");
  if (bVar1) {
    this->horizontal = true;
  }
  else {
    bVar1 = FScanner::Compare(sc,"vertical");
    if (!bVar1) {
      FScanner::ScriptError(sc,"Unknown direction \'%s\'.",sc->String);
    }
  }
  FScanner::MustGetToken(sc,0x2c);
  while (bVar1 = FScanner::CheckToken(sc,0x101), bVar1) {
    bVar1 = FScanner::Compare(sc,"reverse");
    if (bVar1) {
      this->reverse = true;
    }
    else {
      bVar1 = FScanner::Compare(sc,"interpolate");
      if (bVar1) {
        FScanner::MustGetToken(sc,0x28);
        FScanner::MustGetToken(sc,0x104);
        this->interpolationSpeed = sc->Number;
        FScanner::MustGetToken(sc,0x29);
      }
      else {
        FScanner::ScriptError(sc,"Unkown flag \'%s\'.",sc->String);
      }
    }
    bVar1 = FScanner::CheckToken(sc,0x7c);
    if (!bVar1) {
      FScanner::MustGetToken(sc,0x2c);
    }
  }
  SBarInfoCommand::GetCoordinates
            (&this->super_SBarInfoCommand,sc,fullScreenOffsets,&this->x,&this->y);
  bVar1 = FScanner::CheckToken(sc,0x2c);
  if (bVar1) {
    FScanner::MustGetToken(sc,0x104);
    this->border = sc->Number;
    if (this->border != 0) {
      this->reverse = (bool)((this->reverse ^ 0xffU) & 1);
    }
  }
  FScanner::MustGetToken(sc,0x3b);
  if (this->type == HEALTH) {
    if ((((this->super_SBarInfoCommand).script)->interpolateHealth & 1U) == 0) {
      local_2c = this->interpolationSpeed;
    }
    else {
      local_2c = ((this->super_SBarInfoCommand).script)->interpolationSpeed;
    }
    this->interpolationSpeed = local_2c;
  }
  else if (this->type == ARMOR) {
    if ((((this->super_SBarInfoCommand).script)->interpolateArmor & 1U) == 0) {
      local_30 = this->interpolationSpeed;
    }
    else {
      local_30 = ((this->super_SBarInfoCommand).script)->armorInterpolationSpeed;
    }
    this->interpolationSpeed = local_30;
  }
  return;
}

Assistant:

void	Parse(FScanner &sc, bool fullScreenOffsets)
		{
			sc.MustGetToken(TK_StringConst);
			foreground = script->newImage(sc.String);
			sc.MustGetToken(',');
			sc.MustGetToken(TK_StringConst);
			background = script->newImage(sc.String);
			sc.MustGetToken(',');
			sc.MustGetToken(TK_Identifier);
			if(sc.Compare("health"))
			{
				type = HEALTH;
				ParseComparator(sc);
			}
			else if(sc.Compare("armor"))
			{
				type = ARMOR;
				ParseComparator(sc);
			}
			else if(sc.Compare("ammo1"))
				type = AMMO1;
			else if(sc.Compare("ammo2"))
				type = AMMO2;
			else if(sc.Compare("ammo")) //request the next string to be an ammo type
			{
				bool parenthesized = sc.CheckToken('(');

				if(!parenthesized || !sc.CheckToken(TK_StringConst))
						sc.MustGetToken(TK_Identifier);
				type = AMMO;
				data.inventoryItem = PClass::FindActor(sc.String);
				if(data.inventoryItem == NULL || !RUNTIME_CLASS(AAmmo)->IsAncestorOf(data.inventoryItem)) //must be a kind of ammo
				{
					sc.ScriptMessage("'%s' is not a type of ammo.", sc.String);
					data.inventoryItem = RUNTIME_CLASS(AAmmo);
				}

				if(parenthesized) sc.MustGetToken(')');
			}
			else if(sc.Compare("frags"))
				type = FRAGS;
			else if(sc.Compare("kills"))
				type = KILLS;
			else if(sc.Compare("items"))
				type = ITEMS;
			else if(sc.Compare("secrets"))
				type = SECRETS;
			else if(sc.Compare("airtime"))
				type = AIRTIME;
			else if(sc.Compare("savepercent"))
				type = SAVEPERCENT;
			else if(sc.Compare("poweruptime"))
			{
				bool parenthesized = sc.CheckToken('(');

				type = POWERUPTIME;
				if(!parenthesized || !sc.CheckToken(TK_StringConst))
					sc.MustGetToken(TK_Identifier);
				data.inventoryItem = PClass::FindActor(sc.String);
				if(data.inventoryItem == NULL || !RUNTIME_CLASS(APowerupGiver)->IsAncestorOf(data.inventoryItem))
				{
					sc.ScriptMessage("'%s' is not a type of PowerupGiver.", sc.String);
					data.inventoryItem = RUNTIME_CLASS(APowerupGiver);
				}

				if(parenthesized) sc.MustGetToken(')');
			}
			else
			{
				type = INVENTORY;
				data.inventoryItem = PClass::FindActor(sc.String);
				if(data.inventoryItem == NULL || !RUNTIME_CLASS(AInventory)->IsAncestorOf(data.inventoryItem))
				{
					sc.ScriptMessage("'%s' is not a type of inventory item.", sc.String);
					data.inventoryItem = RUNTIME_CLASS(AInventory);
				}
			}
			sc.MustGetToken(',');
			sc.MustGetToken(TK_Identifier);
			if(sc.Compare("horizontal"))
				horizontal = true;
			else if(!sc.Compare("vertical"))
				sc.ScriptError("Unknown direction '%s'.", sc.String);
			sc.MustGetToken(',');
			while(sc.CheckToken(TK_Identifier))
			{
				if(sc.Compare("reverse"))
					reverse = true;
				else if(sc.Compare("interpolate"))
				{
					sc.MustGetToken('(');
					sc.MustGetToken(TK_IntConst);
					interpolationSpeed = sc.Number;
					sc.MustGetToken(')');
				}
				else
					sc.ScriptError("Unkown flag '%s'.", sc.String);
				if(!sc.CheckToken('|'))
					sc.MustGetToken(',');
			}
			GetCoordinates(sc, fullScreenOffsets, x, y);
			if(sc.CheckToken(',')) //border
			{
				sc.MustGetToken(TK_IntConst);
				border = sc.Number;

				// Flip the direction since it represents the area to clip
				if(border != 0)
					reverse = !reverse;
			}
			sc.MustGetToken(';');
		
			if(type == HEALTH)
				interpolationSpeed = script->interpolateHealth ? script->interpolationSpeed : interpolationSpeed;
			else if(type == ARMOR)
				interpolationSpeed = script->interpolateArmor ? script->armorInterpolationSpeed : interpolationSpeed;
		}